

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::insert(SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
         *this,Lhs *val)

{
  Lhs *pLVar1;
  SelectedSummand *in_RSI;
  void *pval;
  SelectedSummand *in_stack_ffffffffffffff58;
  Lhs *in_stack_ffffffffffffff90;
  SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
  *in_stack_ffffffffffffff98;
  
  Kernel::SelectedSummand::SelectedSummand(in_RSI,in_stack_ffffffffffffff58);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs((Lhs *)in_RSI,in_stack_ffffffffffffff58);
  pLVar1 = (Lhs *)insertPositionRaw<Inferences::ALASCA::FourierMotzkinConf::Lhs>
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3e4378);
  Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3e4382);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs((Lhs *)in_RSI,pLVar1);
  return;
}

Assistant:

inline
  void insert(Value val)
  {
    void* pval = insertPositionRaw(val);
    ::new(pval) Value(std::move(val));
  }